

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mspec.c
# Opt level: O2

void apet_force(CHAR_DATA *ch,char *cmd,int delay)

{
  short sVar1;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v9::basic_format_context<fmt::v9::appender,_char>_>_2
  in_R9;
  string_view fmt;
  format_args args;
  allocator<char> local_e3;
  allocator<char> local_e2;
  allocator<char> local_e1;
  CHAR_DATA *ch_local;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  string buffer;
  
  fmt.size_ = 0xc;
  fmt.data_ = (char *)0x2a;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_d8;
  ch_local = ch;
  local_d8._M_dataplus._M_p = cmd;
  ::fmt::v9::vformat_abi_cxx11_
            (&buffer,(v9 *)"You feel the irresistible urge to \'{}}\'.\n\r",fmt,args);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"apet_force",&local_e3);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"interpret_queue",&local_e1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,cmd,&local_e2);
  CQueue::AddToQueue<void(*)(char_data*,std::__cxx11::string),char_data*&,std::__cxx11::string>
            (&RS.Queue,delay,&local_58,&local_78,interpret_queue,&ch_local,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"apet_force",(allocator<char> *)&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b8,"send_to_char_queue",&local_e3);
  CQueue::AddToQueue<void(*)(std::__cxx11::string,char_data*),std::__cxx11::string&,char_data*&>
            (&RS.Queue,delay,&local_98,&local_b8,send_to_char_queue,&buffer,&ch_local);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_98);
  sVar1 = 0x14;
  if (ch_local->wait < 0x14) {
    sVar1 = ch_local->wait;
  }
  ch_local->wait = sVar1;
  std::__cxx11::string::~string((string *)&buffer);
  return;
}

Assistant:

void apet_force(CHAR_DATA *ch, const char *cmd, int delay)
{
	char *tcmd;

	auto buffer = fmt::format("You feel the irresistible urge to '{}}'.\n\r", cmd);

	RS.Queue.AddToQueue(delay, "apet_force", "interpret_queue", interpret_queue, ch, std::string(cmd));
	RS.Queue.AddToQueue(delay, "apet_force", "send_to_char_queue", send_to_char_queue, buffer, ch);

	ch->wait = std::min((int)ch->wait, 20);
}